

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O0

aabb * operator+(aabb *__return_storage_ptr__,aabb *bbox,vec3 *offset)

{
  double *pdVar1;
  vec3 *pvVar2;
  double dVar3;
  interval local_48;
  interval local_38;
  interval local_28;
  vec3 *local_18;
  vec3 *offset_local;
  aabb *bbox_local;
  
  local_18 = offset;
  offset_local = (vec3 *)bbox;
  dVar3 = vec3::x(offset);
  local_28 = operator+(&bbox->x,dVar3);
  pdVar1 = offset_local->e;
  dVar3 = vec3::y(local_18);
  local_38 = operator+((interval *)(pdVar1 + 2),dVar3);
  pvVar2 = offset_local + 1;
  dVar3 = vec3::z(local_18);
  local_48 = operator+((interval *)(pvVar2->e + 1),dVar3);
  aabb::aabb(__return_storage_ptr__,&local_28,&local_38,&local_48);
  return __return_storage_ptr__;
}

Assistant:

aabb operator+(const aabb& bbox, const vec3& offset) {
    return aabb(bbox.x + offset.x(), bbox.y + offset.y(), bbox.z + offset.z());
}